

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround
          (CompilerGLSL *this,string *func,Op op,GroupOperation group_op)

{
  pointer pcVar1;
  string *ts_4;
  runtime_error *prVar2;
  TypeInfo *t;
  pointer ts;
  string op_symbol;
  vector<TypeInfo,_std::allocator<TypeInfo>_> type_infos;
  string result;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8;
  char local_a8 [16];
  vector<TypeInfo,_std::allocator<TypeInfo>_> local_98;
  uint local_7c;
  pointer local_78;
  ulong local_70;
  char (*local_68) [56];
  pointer local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_58 = func;
  if (GroupOperationExclusiveScan < group_op) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_d8._0_8_ = local_d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Unsupported workaround for arithmetic group operation","");
    ::std::runtime_error::runtime_error(prVar2,(string *)local_d8);
    *(undefined ***)prVar2 = &PTR__runtime_error_003f8e68;
    __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::_M_replace
            ((ulong)&local_50,0,(char *)0x0,
             (ulong)(&DAT_00358904 + *(int *)(&DAT_00358904 + (ulong)group_op * 4)));
  local_98.super__Vector_base<TypeInfo,_std::allocator<TypeInfo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<TypeInfo,_std::allocator<TypeInfo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<TypeInfo,_std::allocator<TypeInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  switch(op) {
  case OpGroupNonUniformIAdd:
    pcVar1 = local_d8 + 0x10;
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"uint","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0u","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"uvec2","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"uvec2(0u)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"uvec3","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"uvec3(0u)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"uvec4","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"uvec4(0u)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"int","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"ivec2","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ivec2(0)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"ivec3","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ivec3(0)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"ivec4","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ivec4(0)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    break;
  case OpGroupNonUniformFAdd:
    pcVar1 = local_d8 + 0x10;
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"float","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0.0f","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"vec2","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"vec2(0.0f)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"vec3","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"vec3(0.0f)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"vec4","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"vec4(0.0f)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"double","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0.0LF","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"dvec2","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"dvec2(0.0LF)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"dvec3","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"dvec3(0.0LF)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"dvec4","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"dvec4(0.0LF)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    break;
  case OpGroupNonUniformIMul:
    pcVar1 = local_d8 + 0x10;
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"uint","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1u","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"uvec2","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"uvec2(1u)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"uvec3","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"uvec3(1u)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"uvec4","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"uvec4(1u)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"int","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"ivec2","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ivec2(1)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"ivec3","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ivec3(1)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"ivec4","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ivec4(1)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    goto LAB_001ef3f2;
  case OpGroupNonUniformFMul:
    pcVar1 = local_d8 + 0x10;
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"float","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1.0f","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"vec2","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"vec2(1.0f)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"vec3","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"vec3(1.0f)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"vec4","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"vec4(1.0f)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"double","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0.0LF","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"dvec2","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"dvec2(1.0LF)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"dvec3","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"dvec3(1.0LF)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"dvec4","");
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"dvec4(1.0LF)","");
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)&local_98,(TypeInfo *)local_d8);
LAB_001ef3f2:
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_d8._0_8_ = local_d8 + 0x10;
    local_d8._8_8_ = 0;
    local_d8[0x10] = '\0';
    local_78 = (pointer)local_d8._0_8_;
    ::std::__cxx11::string::_M_replace((ulong)local_d8,0,(char *)0x0,0x35bd55);
    goto LAB_001ef7a7;
  default:
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_d8._0_8_ = local_d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Unsupported workaround for arithmetic group operation","");
    ::std::runtime_error::runtime_error(prVar2,(string *)local_d8);
    *(undefined ***)prVar2 = &PTR__runtime_error_003f8e68;
    __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_);
  }
  local_d8._0_8_ = local_d8 + 0x10;
  local_d8._8_8_ = 0;
  local_d8[0x10] = '\0';
  local_78 = (pointer)local_d8._0_8_;
  ::std::__cxx11::string::_M_replace((ulong)local_d8,0,(char *)0x0,0x35bd52);
LAB_001ef7a7:
  local_60 = local_98.super__Vector_base<TypeInfo,_std::allocator<TypeInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_98.super__Vector_base<TypeInfo,_std::allocator<TypeInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<TypeInfo,_std::allocator<TypeInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_68 = (char (*) [56])0x35bed7;
    if (group_op == GroupOperationExclusiveScan) {
      local_68 = (char (*) [56])0x35be9f;
    }
    local_7c = group_op - GroupOperationInclusiveScan;
    ts = local_98.super__Vector_base<TypeInfo,_std::allocator<TypeInfo>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_70 = (ulong)group_op;
    do {
      statement<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[4]>
                (this,&ts->type,(char (*) [2])0x362d7b,local_58,(char (*) [2])0x379f10,&ts->type,
                 (char (*) [4])0x365f80);
      statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
      this->indent = this->indent + 1;
      ts_4 = &ts->identity;
      statement<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[2]>
                (this,&ts->type,(char (*) [2])0x362d7b,&local_50,(char (*) [4])0x37984e,ts_4,
                 (char (*) [2])0x361554);
      statement<char_const(&)[45]>
                (this,(char (*) [45])"uvec4 active_threads = subgroupBallot(true);");
      statement<char_const(&)[63]>
                (this,(char (*) [63])
                      "if (subgroupBallotBitCount(active_threads) == gl_SubgroupSize)");
      statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
      this->indent = this->indent + 1;
      statement<char_const(&)[35]>(this,(char (*) [35])"uint total = gl_SubgroupSize / 2u;");
      statement<std::__cxx11::string&,char_const(&)[6]>(this,&local_50,(char (*) [6])" = v;");
      statement<char_const(&)[40]>(this,(char (*) [40])"for (uint i = 1u; i <= total; i <<= 1u)");
      statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
      this->indent = this->indent + 1;
      statement<char_const(&)[12]>(this,(char (*) [12])"bool valid;");
      if ((int)local_70 == 0) {
        statement<std::__cxx11::string_const&,char_const(&)[19],std::__cxx11::string&,char_const(&)[30]>
                  (this,&ts->type,(char (*) [19])" s = shuffleXorNV(",&local_50,
                   (char (*) [30])", i, gl_SubgroupSize, valid);");
      }
      else {
        statement<std::__cxx11::string_const&,char_const(&)[18],std::__cxx11::string&,char_const(&)[30]>
                  (this,&ts->type,(char (*) [18])" s = shuffleUpNV(",&local_50,
                   (char (*) [30])", i, gl_SubgroupSize, valid);");
      }
      statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[2]>
                (this,&local_50,(char (*) [2])0x362d7b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 (char (*) [14])" valid ? s : ",ts_4,(char (*) [2])0x361554);
      end_scope(this);
      if ((int)local_70 == 2) {
        statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[24]>
                  (this,&local_50,(char (*) [16])0x35be54,&local_50,
                   (char (*) [24])", 1u, gl_SubgroupSize);");
        statement<char_const(&)[21]>(this,(char (*) [21])"if (subgroupElect())");
        statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
        this->indent = this->indent + 1;
        statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[2]>
                  (this,&local_50,(char (*) [4])0x37984e,ts_4,(char (*) [2])0x361554);
        end_scope(this);
      }
      end_scope(this);
      statement<char_const(&)[5]>(this,(char (*) [5])0x3594e0);
      statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
      this->indent = this->indent + 1;
      if (local_7c < 2) {
        statement<char_const(&)[56]>(this,local_68);
      }
      statement<char_const(&)[44]>
                (this,(char (*) [44])"for (uint i = 0u; i < gl_SubgroupSize; ++i)");
      statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
      this->indent = this->indent + 1;
      statement<char_const(&)[58]>
                (this,(char (*) [58])"bool valid = subgroupBallotBitExtract(active_threads, i);");
      statement<std::__cxx11::string_const&,char_const(&)[39]>
                (this,&ts->type,(char (*) [39])" s = shuffleNV(v, i, gl_SubgroupSize);");
      if (local_7c < 2) {
        statement<char_const(&)[30]>(this,(char (*) [30])"valid = valid && (i < total);");
      }
      statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[2]>
                (this,&local_50,(char (*) [2])0x362d7b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 (char (*) [14])" valid ? s : ",ts_4,(char (*) [2])0x361554);
      end_scope(this);
      end_scope(this);
      statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                (this,(char (*) [8])"return ",&local_50,(char (*) [2])0x361554);
      end_scope(this);
      ts = ts + 1;
    } while (ts != local_60);
  }
  if ((pointer)local_d8._0_8_ != local_78) {
    operator_delete((void *)local_d8._0_8_);
  }
  ::std::vector<TypeInfo,_std::allocator<TypeInfo>_>::~vector(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_subgroup_arithmetic_workaround(const std::string &func, Op op, GroupOperation group_op)
{
	std::string result;
	switch (group_op)
	{
	case GroupOperationReduce:
		result = "reduction";
		break;

	case GroupOperationExclusiveScan:
		result = "excl_scan";
		break;

	case GroupOperationInclusiveScan:
		result = "incl_scan";
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported workaround for arithmetic group operation");
	}

	struct TypeInfo
	{
		std::string type;
		std::string identity;
	};

	std::vector<TypeInfo> type_infos;
	switch (op)
	{
	case OpGroupNonUniformIAdd:
	{
		type_infos.emplace_back(TypeInfo{ "uint", "0u" });
		type_infos.emplace_back(TypeInfo{ "uvec2", "uvec2(0u)" });
		type_infos.emplace_back(TypeInfo{ "uvec3", "uvec3(0u)" });
		type_infos.emplace_back(TypeInfo{ "uvec4", "uvec4(0u)" });
		type_infos.emplace_back(TypeInfo{ "int", "0" });
		type_infos.emplace_back(TypeInfo{ "ivec2", "ivec2(0)" });
		type_infos.emplace_back(TypeInfo{ "ivec3", "ivec3(0)" });
		type_infos.emplace_back(TypeInfo{ "ivec4", "ivec4(0)" });
		break;
	}

	case OpGroupNonUniformFAdd:
	{
		type_infos.emplace_back(TypeInfo{ "float", "0.0f" });
		type_infos.emplace_back(TypeInfo{ "vec2", "vec2(0.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec3", "vec3(0.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec4", "vec4(0.0f)" });
		// ARB_gpu_shader_fp64 is required in GL4.0 which in turn is required by NV_thread_shuffle
		type_infos.emplace_back(TypeInfo{ "double", "0.0LF" });
		type_infos.emplace_back(TypeInfo{ "dvec2", "dvec2(0.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec3", "dvec3(0.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec4", "dvec4(0.0LF)" });
		break;
	}

	case OpGroupNonUniformIMul:
	{
		type_infos.emplace_back(TypeInfo{ "uint", "1u" });
		type_infos.emplace_back(TypeInfo{ "uvec2", "uvec2(1u)" });
		type_infos.emplace_back(TypeInfo{ "uvec3", "uvec3(1u)" });
		type_infos.emplace_back(TypeInfo{ "uvec4", "uvec4(1u)" });
		type_infos.emplace_back(TypeInfo{ "int", "1" });
		type_infos.emplace_back(TypeInfo{ "ivec2", "ivec2(1)" });
		type_infos.emplace_back(TypeInfo{ "ivec3", "ivec3(1)" });
		type_infos.emplace_back(TypeInfo{ "ivec4", "ivec4(1)" });
		break;
	}

	case OpGroupNonUniformFMul:
	{
		type_infos.emplace_back(TypeInfo{ "float", "1.0f" });
		type_infos.emplace_back(TypeInfo{ "vec2", "vec2(1.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec3", "vec3(1.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec4", "vec4(1.0f)" });
		type_infos.emplace_back(TypeInfo{ "double", "0.0LF" });
		type_infos.emplace_back(TypeInfo{ "dvec2", "dvec2(1.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec3", "dvec3(1.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec4", "dvec4(1.0LF)" });
		break;
	}

	default:
		SPIRV_CROSS_THROW("Unsupported workaround for arithmetic group operation");
	}

	const bool op_is_addition = op == OpGroupNonUniformIAdd || op == OpGroupNonUniformFAdd;
	const bool op_is_multiplication = op == OpGroupNonUniformIMul || op == OpGroupNonUniformFMul;
	std::string op_symbol;
	if (op_is_addition)
	{
		op_symbol = "+=";
	}
	else if (op_is_multiplication)
	{
		op_symbol = "*=";
	}

	for (const TypeInfo &t : type_infos)
	{
		statement(t.type, " ", func, "(", t.type, " v)");
		begin_scope();
		statement(t.type, " ", result, " = ", t.identity, ";");
		statement("uvec4 active_threads = subgroupBallot(true);");
		statement("if (subgroupBallotBitCount(active_threads) == gl_SubgroupSize)");
		begin_scope();
		statement("uint total = gl_SubgroupSize / 2u;");
		statement(result, " = v;");
		statement("for (uint i = 1u; i <= total; i <<= 1u)");
		begin_scope();
		statement("bool valid;");
		if (group_op == GroupOperationReduce)
		{
			statement(t.type, " s = shuffleXorNV(", result, ", i, gl_SubgroupSize, valid);");
		}
		else if (group_op == GroupOperationExclusiveScan || group_op == GroupOperationInclusiveScan)
		{
			statement(t.type, " s = shuffleUpNV(", result, ", i, gl_SubgroupSize, valid);");
		}
		if (op_is_addition || op_is_multiplication)
		{
			statement(result, " ", op_symbol, " valid ? s : ", t.identity, ";");
		}
		end_scope();
		if (group_op == GroupOperationExclusiveScan)
		{
			statement(result, " = shuffleUpNV(", result, ", 1u, gl_SubgroupSize);");
			statement("if (subgroupElect())");
			begin_scope();
			statement(result, " = ", t.identity, ";");
			end_scope();
		}
		end_scope();
		statement("else");
		begin_scope();
		if (group_op == GroupOperationExclusiveScan)
		{
			statement("uint total = subgroupBallotBitCount(gl_SubgroupLtMask);");
		}
		else if (group_op == GroupOperationInclusiveScan)
		{
			statement("uint total = subgroupBallotBitCount(gl_SubgroupLeMask);");
		}
		statement("for (uint i = 0u; i < gl_SubgroupSize; ++i)");
		begin_scope();
		statement("bool valid = subgroupBallotBitExtract(active_threads, i);");
		statement(t.type, " s = shuffleNV(v, i, gl_SubgroupSize);");
		if (group_op == GroupOperationExclusiveScan || group_op == GroupOperationInclusiveScan)
		{
			statement("valid = valid && (i < total);");
		}
		if (op_is_addition || op_is_multiplication)
		{
			statement(result, " ", op_symbol, " valid ? s : ", t.identity, ";");
		}
		end_scope();
		end_scope();
		statement("return ", result, ";");
		end_scope();
	}
}